

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Biquad.cpp
# Opt level: O2

void __thiscall
Iir::Biquad::setTwoPole
          (Biquad *this,complex_t pole1,complex_t zero1,complex_t pole2,complex_t zero2)

{
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double a1;
  double in_XMM2_Qa;
  double dVar1;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  double in_XMM4_Qa;
  double b1;
  double in_XMM5_Qa;
  double in_XMM6_Qa;
  double in_XMM7_Qa;
  double b2;
  char errMsgZero [64];
  char errMsgPole [64];
  char local_88 [128];
  
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  builtin_strncpy(local_88 + 0x70,"mplex conjugate",0x10);
  builtin_strncpy(local_88 + 0x60,"ed to be 0 or co",0x10);
  builtin_strncpy(local_88 + 0x50,"of both poles ne",0x10);
  builtin_strncpy(local_88 + 0x40,"imaginary parts ",0x10);
  builtin_strncpy(local_88 + 0x30,"mplex conjugate",0x10);
  builtin_strncpy(local_88 + 0x20,"ed to be 0 or co",0x10);
  builtin_strncpy(local_88 + 0x10,"of both zeros ne",0x10);
  builtin_strncpy(local_88,"imaginary parts ",0x10);
  if ((in_XMM1_Qa != 0.0) || (NAN(in_XMM1_Qa))) {
    if ((in_XMM4_Qa != dVar1) || (NAN(in_XMM4_Qa) || NAN(dVar1))) {
LAB_00105570:
      throw_invalid_argument(local_88 + 0x40);
    }
    else if ((-in_XMM1_Qa != in_XMM5_Qa) || (NAN(-in_XMM1_Qa) || NAN(in_XMM5_Qa)))
    goto LAB_00105570;
    a1 = dVar1 * -2.0;
    dVar1 = dVar1 * dVar1 + in_XMM1_Qa * in_XMM1_Qa;
  }
  else {
    if ((in_XMM5_Qa != 0.0) || (NAN(in_XMM5_Qa))) {
      throw_invalid_argument(local_88 + 0x40);
    }
    a1 = -(dVar1 + in_XMM4_Qa);
    dVar1 = dVar1 * in_XMM4_Qa;
  }
  if (((double)CONCAT44(in_XMM3_Db,in_XMM3_Da) == 0.0) &&
     (!NAN((double)CONCAT44(in_XMM3_Db,in_XMM3_Da)))) {
    if ((in_XMM7_Qa != 0.0) || (NAN(in_XMM7_Qa))) {
      throw_invalid_argument(local_88);
    }
    b1 = -(in_XMM2_Qa + in_XMM6_Qa);
    b2 = in_XMM2_Qa * in_XMM6_Qa;
    goto LAB_00105716;
  }
  if ((in_XMM6_Qa != in_XMM2_Qa) || (NAN(in_XMM6_Qa) || NAN(in_XMM2_Qa))) {
LAB_00105671:
    throw_invalid_argument(local_88);
  }
  else if ((-(double)CONCAT44(in_XMM3_Db,in_XMM3_Da) != in_XMM7_Qa) ||
          (NAN(-(double)CONCAT44(in_XMM3_Db,in_XMM3_Da)) || NAN(in_XMM7_Qa))) goto LAB_00105671;
  b1 = in_XMM2_Qa * -2.0;
  b2 = in_XMM2_Qa * in_XMM2_Qa +
       (double)CONCAT44(in_XMM3_Db,in_XMM3_Da) * (double)CONCAT44(in_XMM3_Db,in_XMM3_Da);
LAB_00105716:
  setCoefficients(this,1.0,a1,dVar1,1.0,b1,b2);
  return;
}

Assistant:

void Biquad::setTwoPole (complex_t pole1, complex_t zero1,
				     complex_t pole2, complex_t zero2)
	{
		const double a0 = 1;
		double a1;
		double a2;
		const char errMsgPole[] = "imaginary parts of both poles need to be 0 or complex conjugate";
		const char errMsgZero[] = "imaginary parts of both zeros need to be 0 or complex conjugate";

		if (pole1.imag() != 0)
		{
			if (pole2 != std::conj (pole1))
				throw_invalid_argument(errMsgPole);
			a1 = -2 * pole1.real();
			a2 = std::norm (pole1);
		}
		else
		{
			if (pole2.imag() != 0)
				throw_invalid_argument(errMsgPole);
			a1 = -(pole1.real() + pole2.real());
			a2 =   pole1.real() * pole2.real();
		}

		const double b0 = 1;
		double b1;
		double b2;

		if (zero1.imag() != 0)
		{
			if (zero2 != std::conj (zero1))
				throw_invalid_argument(errMsgZero);
			b1 = -2 * zero1.real();
			b2 = std::norm (zero1);
		}
		else
		{
			if (zero2.imag() != 0)
				throw_invalid_argument(errMsgZero);

			b1 = -(zero1.real() + zero2.real());
			b2 =   zero1.real() * zero2.real();
		}

		setCoefficients (a0, a1, a2, b0, b1, b2);
	}